

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O0

void soul::heart::Checker::testHEARTRoundTrip(Program *program)

{
  __type_conflict1 _Var1;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  CodeLocation local_b0;
  undefined1 local_a0 [16];
  string local_90;
  Program local_60;
  string local_50;
  undefined1 local_30 [8];
  string dump;
  Program *program_local;
  
  dump.field_2._8_8_ = program;
  ignoreUnused<soul::Program_const&>(program);
  Program::toHEART_abi_cxx11_((string *)local_30,(Program *)dump.field_2._8_8_);
  Program::clone(&local_60,(__fn *)dump.field_2._8_8_,__child_stack,in_ECX,in_R8);
  Program::toHEART_abi_cxx11_(&local_50,&local_60);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,&local_50);
  checkAssertion(_Var1,"dump == program.clone().toHEART()","testHEARTRoundTrip",0x1a9);
  std::__cxx11::string::~string((string *)&local_50);
  Program::~Program(&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"internal test dump",&local_d1);
  std::__cxx11::string::string((string *)&local_f8,(string *)local_30);
  CodeLocation::createFromString(&local_b0,&local_d0,&local_f8);
  Parser::parse((Parser *)local_a0,&local_b0);
  Program::toHEART_abi_cxx11_((string *)(local_a0 + 0x10),(Program *)local_a0);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(local_a0 + 0x10));
  checkAssertion(_Var1,
                 "dump == heart::Parser::parse (CodeLocation::createFromString (\"internal test dump\", dump)).toHEART()"
                 ,"testHEARTRoundTrip",0x1aa);
  std::__cxx11::string::~string((string *)(local_a0 + 0x10));
  Program::~Program((Program *)local_a0);
  CodeLocation::~CodeLocation(&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

static void testHEARTRoundTrip (const Program& program)
    {
        ignoreUnused (program);

       #if SOUL_ENABLE_ASSERTIONS && (SOUL_TEST_HEART_ROUNDTRIP || (SOUL_DEBUG && ! defined (SOUL_TEST_HEART_ROUNDTRIP)))
        auto dump = program.toHEART();
        SOUL_ASSERT (dump == program.clone().toHEART());
        SOUL_ASSERT (dump == heart::Parser::parse (CodeLocation::createFromString ("internal test dump", dump)).toHEART());
       #endif
    }